

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O1

int ffpcln(fitsfile *fptr,int ncols,int *datatype,int *colnum,LONGLONG firstrow,LONGLONG nrows,
          void **array,void **nulval,int *status)

{
  fitsfile *fptr_00;
  long *__ptr;
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  long local_8d8;
  int typecode;
  LONGLONG local_8c0;
  fitsfile *local_8b8;
  long nrowbuf;
  LONGLONG width;
  LONGLONG ntotrows;
  LONGLONG repeat;
  size_t sizes [255];
  
  local_8c0 = nrows;
  memset(sizes,0,0x7f8);
  sizes[0xe] = 1;
  sizes[0xc] = 1;
  sizes[0xb] = 1;
  sizes[0x15] = 2;
  sizes[0x14] = 2;
  sizes[0x1e] = 4;
  sizes[0x1f] = 4;
  sizes[0x28] = 8;
  sizes[0x29] = 8;
  sizes[0x50] = 8;
  sizes[0x51] = 8;
  sizes[0x2a] = 4;
  sizes[0x52] = 8;
  sizes[0xa3] = 0x10;
  iVar6 = *status;
  if (iVar6 < 1) {
    if (ncols < 1) {
      *status = 0;
      iVar6 = 0;
    }
    else {
      local_8b8 = fptr;
      __ptr = (long *)malloc((ulong)(uint)ncols << 3);
      fptr_00 = local_8b8;
      if (__ptr == (long *)0x0) {
        *status = 0x71;
        iVar6 = 0x71;
      }
      else {
        ffgnrwll(local_8b8,&ntotrows,status);
        ffgrsz(fptr_00,&nrowbuf,status);
        uVar2 = 999;
        if ((ulong)(ncols - 1) < 999) {
          uVar2 = (ulong)(ncols - 1);
        }
        uVar5 = 0;
        do {
          ffgtclll(fptr_00,colnum[uVar5],&typecode,&repeat,&width,status);
          __ptr[uVar5] = repeat;
          iVar6 = datatype[uVar5];
          if ((((long)iVar6 == 1) || (iVar6 == 0x10)) || (sizes[iVar6] == 0)) {
            ffpmsg("Cannot write to TBIT or TSTRING datatypes (ffpcln)");
            *status = 0x19a;
          }
          if (typecode < 0) {
            ffpmsg("Cannot write to variable-length data (ffpcln)");
            *status = 0x140;
          }
        } while ((*status == 0) && (bVar7 = uVar2 != uVar5, uVar5 = uVar5 + 1, bVar7));
        iVar6 = *status;
        if (iVar6 == 0) {
          if (ncols == 1) {
            ffpcn(fptr_00,*datatype,*colnum,firstrow,1,local_8c0 * *__ptr,*array,*nulval,status);
            free(__ptr);
            iVar6 = *status;
          }
          else {
            uVar2 = 1;
            if (1 < ncols) {
              uVar2 = (ulong)(uint)ncols;
            }
            lVar3 = 0;
            local_8d8 = firstrow;
            do {
              lVar1 = local_8c0 - lVar3;
              if (lVar1 == 0 || local_8c0 < lVar3) break;
              lVar4 = nrowbuf;
              if (lVar1 < nrowbuf) {
                lVar4 = lVar1;
              }
              uVar5 = 0;
              do {
                ffpcn(local_8b8,datatype[uVar5],colnum[uVar5],lVar3 + 1,1,__ptr[uVar5] * lVar4,
                      (void *)(__ptr[uVar5] * lVar3 * sizes[datatype[uVar5]] + (long)array[uVar5]),
                      nulval[uVar5],status);
                if (*status != 0) {
                  sprintf((char *)&repeat,"Failed to write column %d data rows %lld-%lld (ffpcln)",
                          (ulong)(uint)colnum[uVar5],local_8d8,local_8d8 + lVar4 + -1);
                  ffpmsg((char *)&repeat);
                  break;
                }
                uVar5 = uVar5 + 1;
              } while (uVar2 != uVar5);
              if (*status != 0) {
                lVar4 = 0;
              }
              local_8d8 = local_8d8 + lVar4;
              lVar3 = lVar3 + lVar4;
            } while (*status == 0);
            free(__ptr);
            iVar6 = *status;
          }
        }
        else {
          free(__ptr);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int ffpcln( fitsfile *fptr,   /* I - FITS file pointer                       */
	    int ncols,        /* I - number of columns to write              */
            int  *datatype,   /* I - datatypes of the values                 */
            int  *colnum,     /* I - columns numbers to write (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to write (1 = 1st row)    */
            LONGLONG nrows,       /* I - number of rows to write             */
            void **array,     /* I - array of pointers to values to write    */
            void **nulval,    /* I - array of pointers to values for undefined pixels */
            int  *status)     /* IO - error status                           */
/*
  Write arrays of values to NCOLS table columns. This is an optimization
  to write all columns in one pass through the table.  The datatypes of the
  input arrays are defined by the 3rd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
  Undefined elements for column i that are equal to *(nulval[i]) are set to
  the defined null value, unless nulval[i]=0,
  in which case no checking for undefined values will be performed.
*/
{
    LONGLONG ntotrows, ndone, nwrite, currow;
    long nrowbuf;
    LONGLONG *repeats = 0;
    size_t sizes[255] = {0};
    int icol;

    sizes[TBYTE] = sizes[TSBYTE] = sizes[TLOGICAL] = sizeof(char);
    sizes[TUSHORT] = sizes[TSHORT] = sizeof(short int);
    sizes[TINT] = sizes[TUINT] = sizeof(int);
    sizes[TLONG] = sizes[TULONG] = sizeof(long int);
    sizes[TLONGLONG] = sizes[TULONGLONG] = sizeof(LONGLONG);
    sizes[TFLOAT] = sizeof(float);
    sizes[TDOUBLE] = sizeof(double);
    sizes[TDBLCOMPLEX] = 2*sizeof(double);

    if (*status > 0)
        return(*status);

    if (ncols <= 0) return (*status=0);

    repeats = malloc(sizeof(LONGLONG)*ncols);
    if (repeats == 0) return (*status=MEMORY_ALLOCATION);

    fits_get_num_rowsll(fptr, &ntotrows, status);
    fits_get_rowsize(fptr, &nrowbuf, status);

    /* Retrieve column repeats */
    for (icol = 0; (icol < ncols) && (icol < 1000); icol++) {
      int typecode;
      LONGLONG repeat, width;
      fits_get_coltypell(fptr, colnum[icol], &typecode, 
			 &repeat, &width, status);
      repeats[icol] = repeat;

      if (datatype[icol] == TBIT || datatype[icol] == TSTRING ||
	  sizes[datatype[icol]] == 0) {
	ffpmsg("Cannot write to TBIT or TSTRING datatypes (ffpcln)");
	*status = BAD_DATATYPE;
      }
      if (typecode < 0) {
	ffpmsg("Cannot write to variable-length data (ffpcln)");
	*status = BAD_DIMEN;
      }

      if (*status) break;
    }
    if (*status) {
      free(repeats);
      return *status;
    }

    /* Optimize for 1 column */
    if (ncols == 1) {
      fits_write_colnull(fptr, datatype[0], colnum[0], firstrow, 1,
			 nrows*repeats[0], 
			 array[0], nulval[0], status);
      free(repeats);
      return *status;
    }

    /* Scan through file, in chunks of nrowbuf */
    currow = firstrow;
    ndone = 0;
    while (ndone < nrows) {
      int icol;
      nwrite = (nrows-ndone);
      if (nwrite > nrowbuf) nwrite = nrowbuf;

      for (icol=0; icol<ncols; icol++) {
	LONGLONG nelem1 = (nwrite*repeats[icol]);
	char *array1 = (char *) array[icol] + repeats[icol]*ndone*sizes[datatype[icol]];

	fits_write_colnull(fptr, datatype[icol], colnum[icol], ndone+1, 1, 
			   nelem1, array1, nulval[icol], status);
	if (*status) {
	  char errmsg[100];
	  sprintf(errmsg,
		  "Failed to write column %d data rows %lld-%lld (ffpcln)",
		  colnum[icol], currow, currow+nwrite-1);
	  ffpmsg(errmsg);
	  break;
	}
      }

      if (*status) break;
      currow += nwrite;
      ndone += nwrite;
    }

    free(repeats);
    return *status;
}